

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool openjtalk_speakToFileU16(OpenJTalk *oj,char16_t *text,char16_t *file)

{
  _Bool _Var1;
  size_t sVar2;
  char *pcVar3;
  FILE *__stream;
  char pathU8 [260];
  char acStack_128 [272];
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    if (((text == (char16_t *)0x0 || file == (char16_t *)0x0) ||
        (sVar2 = strlenU16(file), sVar2 == 0)) || (sVar2 = strlenU16(text), sVar2 == 0)) {
      oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
    }
    else {
      pcVar3 = u16tou8_path(file,acStack_128);
      if (pcVar3 != (char *)0x0) {
        __stream = fopen(acStack_128,"wb");
        if (__stream == (FILE *)0x0) {
          oj->errorCode = OPENJTALKERROR_FILE_OPEN_ERROR;
        }
        else {
          pcVar3 = u16tou8(text);
          if (pcVar3 != (char *)0x0) {
            _Var1 = generate_wavFile(oj,pcVar3,(FILE *)__stream);
            free(pcVar3);
            fclose(__stream);
            return _Var1;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakToFileU16(OpenJTalk *oj, const char16_t *text, const char16_t *file)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return false;
	}
	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (file == NULL || text == NULL)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
	if (strlenU16(file) == 0 || strlenU16(text) == 0)
	{
		oj->errorCode = OPENJTALKERROR_STRING_IS_NULL_OR_EMPTY;
		return false;
	}
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	FILE *wavfp = _wfopen((wchar_t *)file, u"wb");
#else
	char pathU8[MAX_PATH];
	if (!u16tou8_path(file, pathU8))
	{
		return false;
	}
	FILE *wavfp = fopen(pathU8, "wb");
#endif
	if (!wavfp)
	{
		oj->errorCode = OPENJTALKERROR_FILE_OPEN_ERROR;
		return false;
	}
	char *buf = u16tou8(text);
	if (!buf)
	{
		return false;
	}
	bool result = generate_wavFile(oj, buf, wavfp);
	if (buf)
	{
		free(buf);
	}
	fclose(wavfp);
	return result;
}